

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# util.h
# Opt level: O1

void pearants(int step,double *AAA,int hit,double *points_x,double *points_y,double *points_z,
             double dist,double *empty_cubs,int *empty_index)

{
  double dVar1;
  double dVar2;
  double dVar3;
  ulong uVar4;
  ulong uVar5;
  int k;
  ulong uVar6;
  ulong uVar7;
  int iVar8;
  int j;
  ulong uVar9;
  
  *empty_index = 0;
  if (0 < step) {
    iVar8 = *empty_index;
    uVar5 = (ulong)(uint)step;
    uVar4 = 0;
    do {
      dVar1 = AAA[uVar4];
      uVar9 = 0;
      do {
        dVar2 = AAA[uVar9];
        uVar6 = 0;
        do {
          if (-1 < hit) {
            uVar7 = 0;
            do {
              if ((((dVar1 <= points_x[uVar7]) && (points_x[uVar7] <= dVar1 + dist)) &&
                  (dVar2 <= points_y[uVar7])) &&
                 (((points_y[uVar7] <= dVar2 + dist && (AAA[uVar6] <= points_z[uVar7])) &&
                  (points_z[uVar7] <= AAA[uVar6] + dist)))) goto LAB_00109e6f;
              uVar7 = uVar7 + 1;
            } while (hit + 1 != uVar7);
          }
          dVar3 = AAA[uVar4];
          *empty_index = iVar8 + 1;
          empty_cubs[iVar8] = dVar3;
          dVar3 = AAA[uVar9];
          *empty_index = iVar8 + 2;
          empty_cubs[(long)iVar8 + 1] = dVar3;
          dVar3 = AAA[uVar6];
          *empty_index = iVar8 + 3;
          empty_cubs[(long)iVar8 + 2] = dVar3;
          iVar8 = iVar8 + 3;
LAB_00109e6f:
          uVar6 = uVar6 + 1;
        } while (uVar6 != uVar5);
        uVar9 = uVar9 + 1;
      } while (uVar9 != uVar5);
      uVar4 = uVar4 + 1;
    } while (uVar4 != uVar5);
  }
  return;
}

Assistant:

void pearants(int step,double *AAA,int hit,double *points_x,double *points_y,
			  double *points_z,double dist,double *empty_cubs,int &empty_index)
{
	double x,y,z;
	int check;
	empty_index=0;
	for (int i = 0; i < step; i++)
	{
		x=AAA[i];
		for (int j = 0; j < step; j++)
		{
			y=AAA[j];
			for (int k = 0; k < step; k++)
			{
				z=AAA[k];
				check=0;
				for (int m = 0; m <= hit; m++)
				{
					if (points_x[m]>= x &&points_x[m]<= x+dist)
					{
						if (points_y[m]>=y &&points_y[m]<= y+dist)
						{
							if (points_z[m]>=z &&points_z[m]<= z+dist)
							{
								check=1;
								break;
							}

						}

					}

				}
				if (check==0)
				{
					empty_cubs[empty_index++]=AAA[i];
					empty_cubs[empty_index++]=AAA[j];
					empty_cubs[empty_index++]=AAA[k];
				}
			}

		}

	}
}